

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O1

void vkt::rasterization::anon_unknown_0::createRasterizationTests(TestCaseGroup *rasterizationTests)

{
  VkPrimitiveTopology VVar1;
  VkFrontFace VVar2;
  undefined4 uVar3;
  TestContext *pTVar4;
  TestNode *pTVar5;
  TestNode *pTVar6;
  long *plVar7;
  long lVar8;
  long lVar9;
  TestNode *pTVar10;
  ostream *poVar11;
  long *plVar12;
  string name;
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  TestContext *local_248;
  long *local_240;
  long local_238;
  long local_230;
  long lStack_228;
  undefined4 *local_220;
  TestNode *local_218;
  allocator<char> local_209;
  long *local_208;
  long local_200;
  long local_1f8;
  long lStack_1f0;
  ios_base local_198 [268];
  VkCullModeFlags local_8c;
  PrimitiveType *local_88;
  FrontFaceOrder *local_80;
  long local_78;
  long local_70;
  long local_68;
  TestNode *local_60;
  CullMode *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  pTVar4 = (rasterizationTests->super_TestNode).m_testCtx;
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,pTVar4,"primitives","Primitive rasterization");
  local_248 = pTVar4;
  local_218 = &rasterizationTests->super_TestNode;
  tcu::TestNode::addChild(&rasterizationTests->super_TestNode,pTVar5);
  pTVar6 = (TestNode *)operator_new(0x78);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"triangles","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result"
             ,"");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d64f80;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x78);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"triangle_strip","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP, verify rasterization result"
             ,"");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d651a8;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x78);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"triangle_fan","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN, verify rasterization result",
             "");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65270;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"lines","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result","")
  ;
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65338;
  *(undefined4 *)&pTVar6[1].m_testCtx = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"line_strip","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP, verify rasterization result",""
            );
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65468;
  *(undefined4 *)&pTVar6[1].m_testCtx = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"lines_wide","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result"
             ,"");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65338;
  *(undefined4 *)&pTVar6[1].m_testCtx = 1;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"line_strip_wide","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP with wide lines, verify rasterization result"
             ,"");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65468;
  *(undefined4 *)&pTVar6[1].m_testCtx = 1;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"points","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,
             "Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",""
            );
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65530;
  *(undefined4 *)&pTVar6[1].m_testCtx = 1;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,local_248,"fill_rules","Primitive fill rules");
  tcu::TestNode::addChild(local_218,pTVar5);
  pTVar6 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"basic_quad","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Verify fill rules","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d655f8;
  *(undefined4 *)&pTVar6[1].m_testCtx = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"basic_quad_reverse","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Verify fill rules","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d655f8;
  *(undefined4 *)&pTVar6[1].m_testCtx = 1;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"clipped_full","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Verify fill rules","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d655f8;
  *(undefined4 *)&pTVar6[1].m_testCtx = 2;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"clipped_partly","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Verify fill rules","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d655f8;
  *(undefined4 *)&pTVar6[1].m_testCtx = 3;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"projected","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Verify fill rules","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d655f8;
  *(undefined4 *)&pTVar6[1].m_testCtx = 4;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  pTVar5 = local_218;
  pTVar4 = local_248;
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar6,pTVar4,"culling","Culling");
  local_60 = pTVar6;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  lVar9 = 0;
  do {
    local_58 = createRasterizationTests::cullModes + lVar9;
    local_8c = createRasterizationTests::cullModes[lVar9].mode;
    lVar8 = 0;
    local_78 = lVar9;
    do {
      local_88 = createRasterizationTests::primitiveTypes + lVar8;
      lVar9 = 0;
      local_70 = lVar8;
      do {
        local_80 = createRasterizationTests::frontOrders + lVar9;
        local_220 = (undefined4 *)0x0;
        local_68 = lVar9;
        do {
          if ((local_8c != 3) ||
             (*(int *)((long)&createRasterizationTests::polygonModes[0].mode + (long)local_220) == 0
             )) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_50,local_58->prefix,&local_209);
            plVar7 = (long *)std::__cxx11::string::append((char *)local_50);
            plVar12 = plVar7 + 2;
            if ((long *)*plVar7 == plVar12) {
              local_230 = *plVar12;
              lStack_228 = plVar7[3];
              local_240 = &local_230;
            }
            else {
              local_230 = *plVar12;
              local_240 = (long *)*plVar7;
            }
            local_238 = plVar7[1];
            *plVar7 = (long)plVar12;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_240);
            local_268 = &local_258;
            plVar12 = plVar7 + 2;
            if ((long *)*plVar7 == plVar12) {
              local_258 = *plVar12;
              lStack_250 = plVar7[3];
            }
            else {
              local_258 = *plVar12;
              local_268 = (long *)*plVar7;
            }
            local_260 = plVar7[1];
            *plVar7 = (long)plVar12;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_268);
            plVar12 = plVar7 + 2;
            if ((long *)*plVar7 == plVar12) {
              local_1f8 = *plVar12;
              lStack_1f0 = plVar7[3];
              local_208 = &local_1f8;
            }
            else {
              local_1f8 = *plVar12;
              local_208 = (long *)*plVar7;
            }
            local_200 = plVar7[1];
            *plVar7 = (long)plVar12;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            if (local_268 != &local_258) {
              operator_delete(local_268,local_258 + 1);
            }
            if (local_240 != &local_230) {
              operator_delete(local_240,local_230 + 1);
            }
            if (local_50[0] != local_40) {
              operator_delete(local_50[0],local_40[0] + 1);
            }
            pTVar5 = (TestNode *)operator_new(0x88);
            local_268 = &local_258;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_268,"Test primitive culling.","");
            VVar1 = local_88->type;
            VVar2 = local_80->mode;
            uVar3 = *(undefined4 *)
                     ((long)&createRasterizationTests::polygonModes[0].mode + (long)local_220);
            tcu::TestCase::TestCase
                      ((TestCase *)pTVar5,local_248,(char *)local_208,(char *)local_268);
            pTVar5[1]._vptr_TestNode = (_func_int **)0x1;
            pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d656f0;
            *(VkCullModeFlags *)&pTVar5[1].m_testCtx = local_8c;
            *(VkPrimitiveTopology *)((long)&pTVar5[1].m_testCtx + 4) = VVar1;
            *(VkFrontFace *)&pTVar5[1].m_name._M_dataplus._M_p = VVar2;
            *(undefined4 *)((long)&pTVar5[1].m_name._M_dataplus._M_p + 4) = uVar3;
            tcu::TestNode::addChild(local_60,pTVar5);
            if (local_268 != &local_258) {
              operator_delete(local_268,local_258 + 1);
            }
            if (local_208 != &local_1f8) {
              operator_delete(local_208,local_1f8 + 1);
            }
          }
          local_220 = (undefined4 *)((long)local_220 + 0x10);
        } while (local_220 != (undefined4 *)0x30);
        lVar9 = local_68 + 1;
      } while (local_68 == 0);
      lVar8 = local_70 + 1;
    } while (lVar8 != 3);
    lVar9 = local_78 + 1;
  } while (lVar9 != 3);
  pTVar5 = (TestNode *)operator_new(0x70);
  pTVar4 = local_248;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,local_248,"interpolation","Test interpolation");
  tcu::TestNode::addChild(local_218,pTVar5);
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,pTVar4,"basic","Non-projective interpolation");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar10 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"triangles","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify triangle interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar10,local_248,(char *)local_208,(char *)local_268);
  pTVar10[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d657b0;
  pTVar10[1].m_testCtx = (TestContext *)0x3;
  tcu::TestNode::addChild(pTVar6,pTVar10);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar10 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"triangle_strip","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify triangle strip interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar10,local_248,(char *)local_208,(char *)local_268);
  pTVar10[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d657b0;
  pTVar10[1].m_testCtx = (TestContext *)0x4;
  tcu::TestNode::addChild(pTVar6,pTVar10);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar10 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"triangle_fan","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify triangle fan interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar10,local_248,(char *)local_208,(char *)local_268);
  pTVar10[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d657b0;
  pTVar10[1].m_testCtx = (TestContext *)0x5;
  tcu::TestNode::addChild(pTVar6,pTVar10);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar10 = (TestNode *)operator_new(0x88);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"lines","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify line interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar10,local_248,(char *)local_208,(char *)local_268);
  pTVar10[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65870;
  pTVar10[1].m_testCtx = (TestContext *)&DAT_00000001;
  *(undefined4 *)&pTVar10[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar6,pTVar10);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar10 = (TestNode *)operator_new(0x88);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"line_strip","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify line strip interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar10,local_248,(char *)local_208,(char *)local_268);
  pTVar10[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65870;
  pTVar10[1].m_testCtx = (TestContext *)0x2;
  *(undefined4 *)&pTVar10[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar6,pTVar10);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar10 = (TestNode *)operator_new(0x88);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"lines_wide","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify wide line interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar10,local_248,(char *)local_208,(char *)local_268);
  pTVar10[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65870;
  pTVar10[1].m_testCtx = (TestContext *)&DAT_00000001;
  *(undefined4 *)&pTVar10[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(pTVar6,pTVar10);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar10 = (TestNode *)operator_new(0x88);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"line_strip_wide","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify wide line strip interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar10,local_248,(char *)local_208,(char *)local_268);
  pTVar10[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar10->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65870;
  pTVar10[1].m_testCtx = (TestContext *)0x2;
  *(undefined4 *)&pTVar10[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(pTVar6,pTVar10);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,local_248,"projected","Projective interpolation");
  tcu::TestNode::addChild(pTVar5,pTVar6);
  pTVar5 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"triangles","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify triangle interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar5,local_248,(char *)local_208,(char *)local_268);
  pTVar5[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d657b0;
  pTVar5[1].m_testCtx = (TestContext *)0x200000003;
  tcu::TestNode::addChild(pTVar6,pTVar5);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar5 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"triangle_strip","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify triangle strip interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar5,local_248,(char *)local_208,(char *)local_268);
  pTVar5[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d657b0;
  pTVar5[1].m_testCtx = (TestContext *)0x200000004;
  tcu::TestNode::addChild(pTVar6,pTVar5);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar5 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"triangle_fan","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify triangle fan interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar5,local_248,(char *)local_208,(char *)local_268);
  pTVar5[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d657b0;
  pTVar5[1].m_testCtx = (TestContext *)0x200000005;
  tcu::TestNode::addChild(pTVar6,pTVar5);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar5 = (TestNode *)operator_new(0x88);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"lines","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify line interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar5,local_248,(char *)local_208,(char *)local_268);
  pTVar5[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65870;
  pTVar5[1].m_testCtx = (TestContext *)0x200000001;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar6,pTVar5);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar5 = (TestNode *)operator_new(0x88);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"line_strip","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify line strip interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar5,local_248,(char *)local_208,(char *)local_268);
  pTVar5[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65870;
  pTVar5[1].m_testCtx = (TestContext *)0x200000002;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar6,pTVar5);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar5 = (TestNode *)operator_new(0x88);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"lines_wide","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify wide line interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar5,local_248,(char *)local_208,(char *)local_268);
  pTVar5[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65870;
  pTVar5[1].m_testCtx = (TestContext *)0x200000001;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(pTVar6,pTVar5);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar5 = (TestNode *)operator_new(0x88);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"line_strip_wide","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify wide line strip interpolation","");
  tcu::TestCase::TestCase((TestCase *)pTVar5,local_248,(char *)local_208,(char *)local_268);
  pTVar5[1]._vptr_TestNode = (_func_int **)0x1;
  pTVar5->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65870;
  pTVar5[1].m_testCtx = (TestContext *)0x200000002;
  *(undefined4 *)&pTVar5[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(pTVar6,pTVar5);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,local_248,"flatshading","Test flatshading");
  tcu::TestNode::addChild(local_218,pTVar5);
  pTVar6 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"triangles","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify triangle flatshading","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d657b0;
  pTVar6[1].m_testCtx = (TestContext *)0x400000003;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"triangle_strip","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify triangle strip flatshading","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d657b0;
  pTVar6[1].m_testCtx = (TestContext *)0x400000004;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x80);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"triangle_fan","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify triangle fan flatshading","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d657b0;
  pTVar6[1].m_testCtx = (TestContext *)0x400000005;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x88);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"lines","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Verify line flatshading","")
  ;
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65870;
  pTVar6[1].m_testCtx = (TestContext *)0x400000001;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x88);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"line_strip","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify line strip flatshading","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65870;
  pTVar6[1].m_testCtx = (TestContext *)0x400000002;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x88);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"lines_wide","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify wide line flatshading","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65870;
  pTVar6[1].m_testCtx = (TestContext *)0x400000001;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  pTVar6 = (TestNode *)operator_new(0x88);
  local_208 = &local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"line_strip_wide","");
  local_268 = &local_258;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"Verify wide line strip flatshading","");
  tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_208,(char *)local_268);
  pTVar6[1]._vptr_TestNode = (_func_int **)0x100000001;
  pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65870;
  pTVar6[1].m_testCtx = (TestContext *)0x400000002;
  *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 1;
  tcu::TestNode::addChild(pTVar5,pTVar6);
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_208 != &local_1f8) {
    operator_delete(local_208,local_1f8 + 1);
  }
  local_220 = &DAT_00b7d010;
  lVar9 = 0;
  do {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_208);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"_multisample_",0xd);
    poVar11 = (ostream *)std::ostream::operator<<(&local_208,2 << ((byte)lVar9 & 0x1f));
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_bit",4);
    pTVar5 = (TestNode *)operator_new(0x70);
    std::__cxx11::stringbuf::str();
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,0xb776e0);
    local_268 = &local_258;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_258 = *plVar12;
      lStack_250 = plVar7[3];
    }
    else {
      local_258 = *plVar12;
      local_268 = (long *)*plVar7;
    }
    local_260 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,local_248,(char *)local_268,"Primitive rasterization");
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    tcu::TestNode::addChild(local_218,pTVar5);
    pTVar6 = (TestNode *)operator_new(0x78);
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"triangles","");
    local_240 = &local_230;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result"
               ,"");
    uVar3 = *local_220;
    tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_268,(char *)local_240);
    *(undefined4 *)&pTVar6[1]._vptr_TestNode = uVar3;
    *(undefined4 *)((long)&pTVar6[1]._vptr_TestNode + 4) = 0;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d64f80;
    tcu::TestNode::addChild(pTVar5,pTVar6);
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pTVar6 = (TestNode *)operator_new(0x80);
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"lines","");
    local_240 = &local_230;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result",
               "");
    tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_268,(char *)local_240);
    *(undefined4 *)&pTVar6[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar6[1]._vptr_TestNode + 4) = 0;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65338;
    tcu::TestNode::addChild(pTVar5,pTVar6);
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pTVar6 = (TestNode *)operator_new(0x80);
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"lines_wide","");
    local_240 = &local_230;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result"
               ,"");
    tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_268,(char *)local_240);
    *(undefined4 *)&pTVar6[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar6[1]._vptr_TestNode + 4) = 0x100000000;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65338;
    tcu::TestNode::addChild(pTVar5,pTVar6);
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pTVar6 = (TestNode *)operator_new(0x80);
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"points","");
    local_240 = &local_230;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,
               "Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",
               "");
    tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_268,(char *)local_240);
    *(undefined4 *)&pTVar6[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar6[1]._vptr_TestNode + 4) = 0x100000000;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65530;
    tcu::TestNode::addChild(pTVar5,pTVar6);
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pTVar5 = (TestNode *)operator_new(0x70);
    std::__cxx11::stringbuf::str();
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,0xb7c2d6);
    local_268 = &local_258;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_258 = *plVar12;
      lStack_250 = plVar7[3];
    }
    else {
      local_258 = *plVar12;
      local_268 = (long *)*plVar7;
    }
    local_260 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,local_248,(char *)local_268,"Primitive fill rules");
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    tcu::TestNode::addChild(local_218,pTVar5);
    pTVar6 = (TestNode *)operator_new(0x80);
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"basic_quad","");
    local_240 = &local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Verify fill rules","");
    tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_268,(char *)local_240);
    *(undefined4 *)&pTVar6[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar6[1]._vptr_TestNode + 4) = 0;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d655f8;
    tcu::TestNode::addChild(pTVar5,pTVar6);
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pTVar6 = (TestNode *)operator_new(0x80);
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"basic_quad_reverse","");
    local_240 = &local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Verify fill rules","");
    tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_268,(char *)local_240);
    *(undefined4 *)&pTVar6[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar6[1]._vptr_TestNode + 4) = 0x100000000;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d655f8;
    tcu::TestNode::addChild(pTVar5,pTVar6);
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pTVar6 = (TestNode *)operator_new(0x80);
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"clipped_full","");
    local_240 = &local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Verify fill rules","");
    tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_268,(char *)local_240);
    *(undefined4 *)&pTVar6[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar6[1]._vptr_TestNode + 4) = 0x200000000;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d655f8;
    tcu::TestNode::addChild(pTVar5,pTVar6);
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pTVar6 = (TestNode *)operator_new(0x80);
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"clipped_partly","");
    local_240 = &local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Verify fill rules","");
    tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_268,(char *)local_240);
    *(undefined4 *)&pTVar6[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar6[1]._vptr_TestNode + 4) = 0x300000000;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d655f8;
    tcu::TestNode::addChild(pTVar5,pTVar6);
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pTVar6 = (TestNode *)operator_new(0x80);
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"projected","");
    local_240 = &local_230;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Verify fill rules","");
    tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_268,(char *)local_240);
    *(undefined4 *)&pTVar6[1]._vptr_TestNode = uVar3;
    *(undefined8 *)((long)&pTVar6[1]._vptr_TestNode + 4) = 0x400000000;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d655f8;
    tcu::TestNode::addChild(pTVar5,pTVar6);
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pTVar5 = (TestNode *)operator_new(0x70);
    std::__cxx11::stringbuf::str();
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_240,0,(char *)0x0,0xb7c3ba);
    local_268 = &local_258;
    plVar12 = plVar7 + 2;
    if ((long *)*plVar7 == plVar12) {
      local_258 = *plVar12;
      lStack_250 = plVar7[3];
    }
    else {
      local_258 = *plVar12;
      local_268 = (long *)*plVar7;
    }
    local_260 = plVar7[1];
    *plVar7 = (long)plVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar5,local_248,(char *)local_268,"Test interpolation");
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    tcu::TestNode::addChild(local_218,pTVar5);
    pTVar6 = (TestNode *)operator_new(0x80);
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"triangles","");
    local_240 = &local_230;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,"Verify triangle interpolation","");
    tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_268,(char *)local_240);
    *(undefined4 *)&pTVar6[1]._vptr_TestNode = uVar3;
    *(undefined4 *)((long)&pTVar6[1]._vptr_TestNode + 4) = 0;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d657b0;
    pTVar6[1].m_testCtx = (TestContext *)0x3;
    tcu::TestNode::addChild(pTVar5,pTVar6);
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pTVar6 = (TestNode *)operator_new(0x88);
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"lines","");
    local_240 = &local_230;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,"Verify line interpolation","");
    tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_268,(char *)local_240);
    *(undefined4 *)&pTVar6[1]._vptr_TestNode = uVar3;
    *(undefined4 *)((long)&pTVar6[1]._vptr_TestNode + 4) = 0;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65870;
    pTVar6[1].m_testCtx = (TestContext *)&DAT_00000001;
    *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 0;
    tcu::TestNode::addChild(pTVar5,pTVar6);
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    pTVar6 = (TestNode *)operator_new(0x88);
    local_268 = &local_258;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"lines_wide","");
    local_240 = &local_230;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,"Verify wide line interpolation","");
    tcu::TestCase::TestCase((TestCase *)pTVar6,local_248,(char *)local_268,(char *)local_240);
    *(undefined4 *)&pTVar6[1]._vptr_TestNode = uVar3;
    *(undefined4 *)((long)&pTVar6[1]._vptr_TestNode + 4) = 0;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d65870;
    pTVar6[1].m_testCtx = (TestContext *)&DAT_00000001;
    *(undefined4 *)&pTVar6[1].m_name._M_dataplus._M_p = 1;
    tcu::TestNode::addChild(pTVar5,pTVar6);
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if (local_268 != &local_258) {
      operator_delete(local_268,local_258 + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_208);
    std::ios_base::~ios_base(local_198);
    lVar9 = lVar9 + 1;
    local_220 = local_220 + 1;
  } while (lVar9 != 6);
  return;
}

Assistant:

void createRasterizationTests (tcu::TestCaseGroup* rasterizationTests)
{
	tcu::TestContext&	testCtx		=	rasterizationTests->getTestContext();

	// .primitives
	{
		tcu::TestCaseGroup* const primitives = new tcu::TestCaseGroup(testCtx, "primitives", "Primitive rasterization");

		rasterizationTests->addChild(primitives);

		primitives->addChild(new BaseTestCase<TrianglesTestInstance>		(testCtx, "triangles",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result"));
		primitives->addChild(new BaseTestCase<TriangleStripTestInstance>	(testCtx, "triangle_strip",		"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP, verify rasterization result"));
		primitives->addChild(new BaseTestCase<TriangleFanTestInstance>		(testCtx, "triangle_fan",		"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN, verify rasterization result"));
		primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new WidenessTestCase<LineStripTestInstance>	(testCtx, "line_strip",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP, verify rasterization result",						PRIMITIVEWIDENESS_NARROW));
		primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines_wide",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new WidenessTestCase<LineStripTestInstance>	(testCtx, "line_strip_wide",	"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_STRIP with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE));
		primitives->addChild(new WidenessTestCase<PointTestInstance>		(testCtx, "points",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",						PRIMITIVEWIDENESS_WIDE));
	}

	// .fill_rules
	{
		tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(testCtx, "fill_rules", "Primitive fill rules");

		rasterizationTests->addChild(fillRules);

		fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_BASIC));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad_reverse",	"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_REVERSED));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_full",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_FULL));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_partly",		"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_PARTIAL));
		fillRules->addChild(new FillRuleTestCase(testCtx,	"projected",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_PROJECTED));
	}

	// .culling
	{
		static const struct CullMode
		{
			VkCullModeFlags	mode;
			const char*		prefix;
		} cullModes[] =
		{
			{ VK_CULL_MODE_FRONT_BIT,				"front_"	},
			{ VK_CULL_MODE_BACK_BIT,				"back_"		},
			{ VK_CULL_MODE_FRONT_AND_BACK,			"both_"		},
		};
		static const struct PrimitiveType
		{
			VkPrimitiveTopology	type;
			const char*			name;
		} primitiveTypes[] =
		{
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,			"triangles"			},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,			"triangle_strip"	},
			{ VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,			"triangle_fan"		},
		};
		static const struct FrontFaceOrder
		{
			VkFrontFace	mode;
			const char*	postfix;
		} frontOrders[] =
		{
			{ VK_FRONT_FACE_COUNTER_CLOCKWISE,	""			},
			{ VK_FRONT_FACE_CLOCKWISE,			"_reverse"	},
		};

		static const struct PolygonMode
		{
			VkPolygonMode	mode;
			const char*		name;
		} polygonModes[] =
		{
			{ VK_POLYGON_MODE_FILL,		""		},
			{ VK_POLYGON_MODE_LINE,		"_line"		},
			{ VK_POLYGON_MODE_POINT,	"_point"	}
		};

		tcu::TestCaseGroup* const culling = new tcu::TestCaseGroup(testCtx, "culling", "Culling");

		rasterizationTests->addChild(culling);

		for (int cullModeNdx	= 0; cullModeNdx	< DE_LENGTH_OF_ARRAY(cullModes);		++cullModeNdx)
		for (int primitiveNdx	= 0; primitiveNdx	< DE_LENGTH_OF_ARRAY(primitiveTypes);	++primitiveNdx)
		for (int frontOrderNdx	= 0; frontOrderNdx	< DE_LENGTH_OF_ARRAY(frontOrders);		++frontOrderNdx)
		for (int polygonModeNdx = 0; polygonModeNdx	< DE_LENGTH_OF_ARRAY(polygonModes);		++polygonModeNdx)
		{
			if (!(cullModes[cullModeNdx].mode == VK_CULL_MODE_FRONT_AND_BACK && polygonModes[polygonModeNdx].mode != VK_POLYGON_MODE_FILL))
			{
				const std::string name = std::string(cullModes[cullModeNdx].prefix) + primitiveTypes[primitiveNdx].name + frontOrders[frontOrderNdx].postfix + polygonModes[polygonModeNdx].name;
				culling->addChild(new CullingTestCase(testCtx, name, "Test primitive culling.", cullModes[cullModeNdx].mode, primitiveTypes[primitiveNdx].type, frontOrders[frontOrderNdx].mode, polygonModes[polygonModeNdx].mode));
			}
		}
	}

	// .interpolation
	{
		tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(testCtx, "interpolation", "Test interpolation");

		rasterizationTests->addChild(interpolation);

		// .basic
		{
			tcu::TestCaseGroup* const basic = new tcu::TestCaseGroup(testCtx, "basic", "Non-projective interpolation");

			interpolation->addChild(basic);

			basic->addChild(new TriangleInterpolationTestCase		(testCtx, "triangles",		"Verify triangle interpolation",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_strip",	"Verify triangle strip interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_NONE));
			basic->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_fan",	"Verify triangle fan interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,		INTERPOLATIONFLAGS_NONE));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "lines",			"Verify line interpolation",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "line_strip",		"Verify line strip interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "lines_wide",		"Verify wide line interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
			basic->addChild(new LineInterpolationTestCase			(testCtx, "line_strip_wide","Verify wide line strip interpolation",	VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE));
		}

		// .projected
		{
			tcu::TestCaseGroup* const projected = new tcu::TestCaseGroup(testCtx, "projected", "Projective interpolation");

			interpolation->addChild(projected);

			projected->addChild(new TriangleInterpolationTestCase	(testCtx, "triangles",		"Verify triangle interpolation",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTestCase	(testCtx, "triangle_strip",	"Verify triangle strip interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new TriangleInterpolationTestCase	(testCtx, "triangle_fan",	"Verify triangle fan interpolation",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,		INTERPOLATIONFLAGS_PROJECTED));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "lines",			"Verify line interpolation",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "line_strip",		"Verify line strip interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_NARROW));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "lines_wide",		"Verify wide line interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
			projected->addChild(new LineInterpolationTestCase		(testCtx, "line_strip_wide","Verify wide line strip interpolation",	VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_PROJECTED,	PRIMITIVEWIDENESS_WIDE));
		}
	}

	// .flatshading
	{
		tcu::TestCaseGroup* const flatshading = new tcu::TestCaseGroup(testCtx, "flatshading", "Test flatshading");

		rasterizationTests->addChild(flatshading);

		flatshading->addChild(new TriangleInterpolationTestCase		(testCtx, "triangles",		"Verify triangle flatshading",			VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_strip",	"Verify triangle strip flatshading",	VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP,	INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new TriangleInterpolationTestCase		(testCtx, "triangle_fan",	"Verify triangle fan flatshading",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN,		INTERPOLATIONFLAGS_FLATSHADE));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "lines",			"Verify line flatshading",				VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "line_strip",		"Verify line strip flatshading",		VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_NARROW));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "lines_wide",		"Verify wide line flatshading",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
		flatshading->addChild(new LineInterpolationTestCase			(testCtx, "line_strip_wide","Verify wide line strip flatshading",	VK_PRIMITIVE_TOPOLOGY_LINE_STRIP,		INTERPOLATIONFLAGS_FLATSHADE,	PRIMITIVEWIDENESS_WIDE));
	}

	const VkSampleCountFlagBits samples[] =
	{
		VK_SAMPLE_COUNT_2_BIT,
		VK_SAMPLE_COUNT_4_BIT,
		VK_SAMPLE_COUNT_8_BIT,
		VK_SAMPLE_COUNT_16_BIT,
		VK_SAMPLE_COUNT_32_BIT,
		VK_SAMPLE_COUNT_64_BIT
	};

	for (int samplesNdx = 0; samplesNdx < DE_LENGTH_OF_ARRAY(samples); samplesNdx++)
	{
		std::ostringstream caseName;

		caseName << "_multisample_" << (2 << samplesNdx) << "_bit";

		// .primitives
		{
			tcu::TestCaseGroup* const primitives = new tcu::TestCaseGroup(testCtx, ("primitives" + caseName.str()).c_str(), "Primitive rasterization");

			rasterizationTests->addChild(primitives);

			primitives->addChild(new BaseTestCase<TrianglesTestInstance>		(testCtx, "triangles",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST, verify rasterization result",					samples[samplesNdx]));
			primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST, verify rasterization result",						PRIMITIVEWIDENESS_NARROW,	samples[samplesNdx]));
			primitives->addChild(new WidenessTestCase<LinesTestInstance>		(testCtx, "lines_wide",			"Render primitives as VK_PRIMITIVE_TOPOLOGY_LINE_LIST with wide lines, verify rasterization result",		PRIMITIVEWIDENESS_WIDE,		samples[samplesNdx]));
			primitives->addChild(new WidenessTestCase<PointTestInstance>		(testCtx, "points",				"Render primitives as VK_PRIMITIVE_TOPOLOGY_POINT_LIST, verify rasterization result",						PRIMITIVEWIDENESS_WIDE,		samples[samplesNdx]));
		}

		// .fill_rules
		{
			tcu::TestCaseGroup* const fillRules = new tcu::TestCaseGroup(testCtx, ("fill_rules" + caseName.str()).c_str(), "Primitive fill rules");

			rasterizationTests->addChild(fillRules);

			fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_BASIC,			samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"basic_quad_reverse",	"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_REVERSED,		samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_full",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_FULL,	samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"clipped_partly",		"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_CLIPPED_PARTIAL,	samples[samplesNdx]));
			fillRules->addChild(new FillRuleTestCase(testCtx,	"projected",			"Verify fill rules",	FillRuleTestInstance::FILLRULECASE_PROJECTED,		samples[samplesNdx]));
		}

		// .interpolation
		{
			tcu::TestCaseGroup* const interpolation = new tcu::TestCaseGroup(testCtx, ("interpolation" + caseName.str()).c_str(), "Test interpolation");

			rasterizationTests->addChild(interpolation);

			interpolation->addChild(new TriangleInterpolationTestCase		(testCtx, "triangles",		"Verify triangle interpolation",		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,	INTERPOLATIONFLAGS_NONE,								samples[samplesNdx]));
			interpolation->addChild(new LineInterpolationTestCase			(testCtx, "lines",			"Verify line interpolation",			VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_NARROW,	samples[samplesNdx]));
			interpolation->addChild(new LineInterpolationTestCase			(testCtx, "lines_wide",		"Verify wide line interpolation",		VK_PRIMITIVE_TOPOLOGY_LINE_LIST,		INTERPOLATIONFLAGS_NONE,	PRIMITIVEWIDENESS_WIDE,		samples[samplesNdx]));
		}
	}
}